

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.hpp
# Opt level: O0

RealType __thiscall OpenMD::SelectionEvaluator::getSurfaceArea(SelectionEvaluator *this)

{
  long in_RDI;
  RealType local_8;
  
  if ((*(byte *)(in_RDI + 0x532) & 1) == 0) {
    snprintf(painCave.errMsg,2000,"SelectionEvaluator Error: %s\n","No Surface Area For You!");
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
    local_8 = 0.0;
  }
  else {
    local_8 = *(RealType *)(in_RDI + 0x538);
  }
  return local_8;
}

Assistant:

RealType getSurfaceArea() {
      if (hasSurfaceArea_) {
        return surfaceArea_;
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "SelectionEvaluator Error: %s\n", "No Surface Area For You!");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
        return 0.0;
      }
    }